

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O0

void __thiscall
libcellml::HistoryEpoch::setDestinationModel
          (HistoryEpoch *this,ImportedEntityConstPtr *importedEntity)

{
  bool bVar1;
  element_type *this_00;
  ImportedEntity local_38;
  element_type *local_18;
  ImportedEntityConstPtr *importedEntity_local;
  HistoryEpoch *this_local;
  
  local_18 = (element_type *)importedEntity;
  importedEntity_local = (ImportedEntityConstPtr *)this;
  this_00 = std::
            __shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)importedEntity);
  bVar1 = ImportedEntity::isImport(this_00);
  if (bVar1) {
    std::
    __shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_18);
    ImportedEntity::importSource(&local_38);
    std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&local_38);
    ImportSource::model((ImportSource *)&stack0xffffffffffffffd8);
    std::shared_ptr<libcellml::Model>::operator=
              (&this->mDestinationModel,(shared_ptr<libcellml::Model> *)&stack0xffffffffffffffd8);
    std::shared_ptr<libcellml::Model>::~shared_ptr
              ((shared_ptr<libcellml::Model> *)&stack0xffffffffffffffd8);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_38);
  }
  return;
}

Assistant:

void HistoryEpoch::setDestinationModel(const ImportedEntityConstPtr &importedEntity)
{
    if (importedEntity->isImport()) {
        mDestinationModel = importedEntity->importSource()->model();
    }
}